

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
helics::ValueFederateManager::queryUpdates
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ValueFederateManager *this)

{
  int ii;
  const_iterator __begin1;
  shared_handle inpHandle;
  const_iterator __end1;
  value_type_conflict2 local_64;
  const_iterator local_60;
  shared_handle local_48;
  const_iterator local_30;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(&local_48,&this->inputs);
  local_64 = 0;
  gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::begin
            (&local_60,&(local_48.data)->dataStorage);
  gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
            (&local_30,&(local_48.data)->dataStorage);
  while ((local_60.offset != local_30.offset || (local_60.vec != local_30.vec))) {
    if ((local_60.ptr)->hasUpdate == true) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_64);
    }
    local_64 = local_64 + 1;
    gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
    operator++(&local_60);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48.m_handle_lock);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ValueFederateManager::queryUpdates()
{
    std::vector<int> updates;
    auto inpHandle = inputs.lock_shared();
    int ii = 0;
    for (const auto& inp : *inpHandle) {
        if (inp.hasUpdate) {
            updates.push_back(ii);
        }
        ++ii;
    }
    return updates;
}